

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O1

lzo_uint32 lzo_adler32(lzo_uint32 adler,uchar *buf,lzo_uint len)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  
  if (buf == (uchar *)0x0) {
    return 1;
  }
  uVar1 = adler >> 0x10;
  uVar11 = adler & 0xffff;
  if (len != 0) {
    do {
      uVar3 = 0x15b0;
      if (len < 0x15b0) {
        uVar3 = len;
      }
      uVar13 = uVar3 & 0xffffffff;
      uVar12 = (uint)uVar3;
      if (0xf < len) {
        do {
          iVar14 = *buf + uVar11;
          iVar4 = (uint)buf[1] + iVar14;
          iVar15 = (uint)buf[2] + iVar4;
          iVar5 = (uint)buf[3] + iVar15;
          iVar16 = (uint)buf[4] + iVar5;
          iVar6 = (uint)buf[5] + iVar16;
          iVar17 = (uint)buf[6] + iVar6;
          iVar7 = (uint)buf[7] + iVar17;
          iVar18 = (uint)buf[8] + iVar7;
          iVar8 = (uint)buf[9] + iVar18;
          iVar19 = (uint)buf[10] + iVar8;
          iVar9 = (uint)buf[0xb] + iVar19;
          iVar20 = (uint)buf[0xc] + iVar9;
          iVar10 = (uint)buf[0xd] + iVar20;
          iVar21 = (uint)buf[0xe] + iVar10;
          uVar11 = (uint)buf[0xf] + iVar21;
          uVar1 = uVar1 + iVar14 + iVar4 + iVar15 + iVar5 + iVar16 + iVar6 + iVar17 + iVar7 + iVar18
                  + iVar8 + iVar19 + iVar9 + iVar20 + iVar10 + iVar21 + uVar11;
          buf = buf + 0x10;
          uVar12 = (int)uVar13 - 0x10;
          uVar13 = (ulong)uVar12;
        } while (0xf < uVar12);
      }
      if (uVar12 != 0) {
        lVar2 = 0;
        do {
          uVar11 = uVar11 + buf[lVar2];
          uVar1 = uVar1 + uVar11;
          lVar2 = lVar2 + 1;
        } while (uVar12 != (uint)lVar2);
        buf = buf + (ulong)(uVar12 - 1) + 1;
      }
      len = len - uVar3;
      uVar11 = uVar11 % 0xfff1;
      uVar1 = uVar1 % 0xfff1;
    } while (len != 0);
  }
  return uVar1 << 0x10 | uVar11;
}

Assistant:

LZO_PUBLIC(lzo_uint32)
lzo_adler32(lzo_uint32 adler, const lzo_bytep buf, lzo_uint len)
{
    lzo_uint32 s1 = adler & 0xffff;
    lzo_uint32 s2 = (adler >> 16) & 0xffff;
    unsigned k;

    if (buf == NULL)
        return 1;

    while (len > 0)
    {
        k = len < LZO_NMAX ? (unsigned) len : LZO_NMAX;
        len -= k;
        if (k >= 16) do
        {
            LZO_DO16(buf,0);
            buf += 16;
            k -= 16;
        } while (k >= 16);
        if (k != 0) do
        {
            s1 += *buf++;
            s2 += s1;
        } while (--k > 0);
        s1 %= LZO_BASE;
        s2 %= LZO_BASE;
    }
    return (s2 << 16) | s1;
}